

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.hh
# Opt level: O3

optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> * __thiscall
tinyusdz::crate::CrateValue::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
          (optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
           *__return_storage_ptr__,CrateValue *this)

{
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> local_30;
  
  tinyusdz::value::Value::get_value<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
            (&local_30,&this->value_,false);
  __return_storage_ptr__->has_value_ = local_30.has_value_;
  if (local_30.has_value_ == true) {
    *(anon_struct_8_0_00000001_for___align *)&__return_storage_ptr__->contained =
         local_30.contained.data.__align;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 8) = local_30.contained._8_8_;
    *(undefined8 *)((long)&__return_storage_ptr__->contained + 0x10) = local_30.contained._16_8_;
    local_30.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_30.contained._8_8_ = 0;
    local_30.contained._16_8_ = 0;
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
              ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_30.contained);
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value() const {
    return value_.get_value<T>();
  }